

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall chrono::ChArchiveOut::out_version(ChArchiveOut *this,int mver,type_info *mtype)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  ChClassFactory *this_00;
  string *psVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  string class_name_polished;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  pointer local_30;
  int *local_28;
  undefined1 local_20;
  
  if ((this->super_ChArchive).use_versions == true) {
    local_74 = mver;
    this_00 = ChClassFactory::GetGlobalClassFactory();
    psVar9 = ChClassFactory::_GetClassTagName_abi_cxx11_(this_00,mtype);
    std::__cxx11::string::string
              ((string *)&local_70,(psVar9->_M_dataplus)._M_p,(allocator *)&local_50);
    if (local_70._M_string_length != 0) {
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar22 = vpbroadcastb_avx512bw(ZEXT116(0x3c));
      auVar23 = vpbroadcastb_avx512bw(ZEXT116(0x5b));
      auVar24 = vpbroadcastq_avx512f();
      uVar10 = 0;
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vporq_avx512f(auVar25,auVar14);
        auVar27 = vporq_avx512f(auVar25,auVar18);
        auVar28 = vporq_avx512f(auVar25,auVar20);
        auVar29 = vporq_avx512f(auVar25,auVar15);
        auVar30 = vporq_avx512f(auVar25,auVar16);
        auVar31 = vporq_avx512f(auVar25,auVar17);
        auVar32 = vporq_avx512f(auVar25,auVar19);
        auVar25 = vporq_avx512f(auVar25,auVar21);
        uVar1 = vpcmpuq_avx512f(auVar25,auVar24,2);
        uVar2 = vpcmpuq_avx512f(auVar28,auVar24,2);
        uVar3 = vpcmpuq_avx512f(auVar27,auVar24,2);
        uVar4 = vpcmpuq_avx512f(auVar26,auVar24,2);
        bVar8 = (byte)uVar4;
        uVar4 = vpcmpuq_avx512f(auVar32,auVar24,2);
        uVar5 = vpcmpuq_avx512f(auVar30,auVar24,2);
        uVar6 = vpcmpuq_avx512f(auVar31,auVar24,2);
        uVar7 = vpcmpuq_avx512f(auVar29,auVar24,2);
        uVar13 = CONCAT11(bVar8,(byte)uVar7);
        uVar11 = CONCAT22(uVar13,CONCAT11((byte)uVar5,(byte)uVar6));
        uVar12 = CONCAT44(uVar11,CONCAT22(CONCAT11((byte)uVar3,(byte)uVar4),
                                          CONCAT11((byte)uVar2,(byte)uVar1)));
        auVar25 = vmovdqu8_avx512bw(*(undefined1 (*) [64])(local_70._M_dataplus._M_p + uVar10));
        auVar26[1] = ((byte)(uVar12 >> 1) & 1) * auVar25[1];
        auVar26[0] = ((byte)uVar1 & 1) * auVar25[0];
        auVar26[2] = ((byte)(uVar12 >> 2) & 1) * auVar25[2];
        auVar26[3] = ((byte)(uVar12 >> 3) & 1) * auVar25[3];
        auVar26[4] = ((byte)(uVar12 >> 4) & 1) * auVar25[4];
        auVar26[5] = ((byte)(uVar12 >> 5) & 1) * auVar25[5];
        auVar26[6] = ((byte)(uVar12 >> 6) & 1) * auVar25[6];
        auVar26[7] = ((byte)(uVar12 >> 7) & 1) * auVar25[7];
        auVar26[8] = ((byte)uVar2 & 1) * auVar25[8];
        auVar26[9] = ((byte)(uVar12 >> 9) & 1) * auVar25[9];
        auVar26[10] = ((byte)(uVar12 >> 10) & 1) * auVar25[10];
        auVar26[0xb] = ((byte)(uVar12 >> 0xb) & 1) * auVar25[0xb];
        auVar26[0xc] = ((byte)(uVar12 >> 0xc) & 1) * auVar25[0xc];
        auVar26[0xd] = ((byte)(uVar12 >> 0xd) & 1) * auVar25[0xd];
        auVar26[0xe] = ((byte)(uVar12 >> 0xe) & 1) * auVar25[0xe];
        auVar26[0xf] = ((byte)(uVar12 >> 0xf) & 1) * auVar25[0xf];
        auVar26[0x10] = ((byte)uVar4 & 1) * auVar25[0x10];
        auVar26[0x11] = ((byte)(uVar12 >> 0x11) & 1) * auVar25[0x11];
        auVar26[0x12] = ((byte)(uVar12 >> 0x12) & 1) * auVar25[0x12];
        auVar26[0x13] = ((byte)(uVar12 >> 0x13) & 1) * auVar25[0x13];
        auVar26[0x14] = ((byte)(uVar12 >> 0x14) & 1) * auVar25[0x14];
        auVar26[0x15] = ((byte)(uVar12 >> 0x15) & 1) * auVar25[0x15];
        auVar26[0x16] = ((byte)(uVar12 >> 0x16) & 1) * auVar25[0x16];
        auVar26[0x17] = ((byte)(uVar12 >> 0x17) & 1) * auVar25[0x17];
        auVar26[0x18] = ((byte)uVar3 & 1) * auVar25[0x18];
        auVar26[0x19] = ((byte)(uVar12 >> 0x19) & 1) * auVar25[0x19];
        auVar26[0x1a] = ((byte)(uVar12 >> 0x1a) & 1) * auVar25[0x1a];
        auVar26[0x1b] = ((byte)(uVar12 >> 0x1b) & 1) * auVar25[0x1b];
        auVar26[0x1c] = ((byte)(uVar12 >> 0x1c) & 1) * auVar25[0x1c];
        auVar26[0x1d] = ((byte)(uVar12 >> 0x1d) & 1) * auVar25[0x1d];
        auVar26[0x1e] = ((byte)(uVar12 >> 0x1e) & 1) * auVar25[0x1e];
        auVar26[0x1f] = ((byte)(uVar12 >> 0x1f) & 1) * auVar25[0x1f];
        auVar26[0x20] = ((byte)uVar6 & 1) * auVar25[0x20];
        auVar26[0x21] = ((byte)(uVar11 >> 1) & 1) * auVar25[0x21];
        auVar26[0x22] = ((byte)(uVar11 >> 2) & 1) * auVar25[0x22];
        auVar26[0x23] = ((byte)(uVar11 >> 3) & 1) * auVar25[0x23];
        auVar26[0x24] = ((byte)(uVar11 >> 4) & 1) * auVar25[0x24];
        auVar26[0x25] = ((byte)(uVar11 >> 5) & 1) * auVar25[0x25];
        auVar26[0x26] = ((byte)(uVar11 >> 6) & 1) * auVar25[0x26];
        auVar26[0x27] = ((byte)(uVar11 >> 7) & 1) * auVar25[0x27];
        auVar26[0x28] = ((byte)uVar5 & 1) * auVar25[0x28];
        auVar26[0x29] = ((byte)(uVar11 >> 9) & 1) * auVar25[0x29];
        auVar26[0x2a] = ((byte)(uVar11 >> 10) & 1) * auVar25[0x2a];
        auVar26[0x2b] = ((byte)(uVar11 >> 0xb) & 1) * auVar25[0x2b];
        auVar26[0x2c] = ((byte)(uVar11 >> 0xc) & 1) * auVar25[0x2c];
        auVar26[0x2d] = ((byte)(uVar11 >> 0xd) & 1) * auVar25[0x2d];
        auVar26[0x2e] = ((byte)(uVar11 >> 0xe) & 1) * auVar25[0x2e];
        auVar26[0x2f] = ((byte)(uVar11 >> 0xf) & 1) * auVar25[0x2f];
        auVar26[0x30] = ((byte)uVar7 & 1) * auVar25[0x30];
        auVar26[0x31] = ((byte)(uVar13 >> 1) & 1) * auVar25[0x31];
        auVar26[0x32] = ((byte)(uVar13 >> 2) & 1) * auVar25[0x32];
        auVar26[0x33] = ((byte)(uVar13 >> 3) & 1) * auVar25[0x33];
        auVar26[0x34] = ((byte)(uVar13 >> 4) & 1) * auVar25[0x34];
        auVar26[0x35] = ((byte)(uVar13 >> 5) & 1) * auVar25[0x35];
        auVar26[0x36] = ((byte)(uVar13 >> 6) & 1) * auVar25[0x36];
        auVar26[0x37] = ((byte)(uVar13 >> 7) & 1) * auVar25[0x37];
        auVar26[0x38] = (bVar8 & 1) * auVar25[0x38];
        auVar26[0x39] = (bVar8 >> 1 & 1) * auVar25[0x39];
        auVar26[0x3a] = (bVar8 >> 2 & 1) * auVar25[0x3a];
        auVar26[0x3b] = (bVar8 >> 3 & 1) * auVar25[0x3b];
        auVar26[0x3c] = (bVar8 >> 4 & 1) * auVar25[0x3c];
        auVar26[0x3d] = (bVar8 >> 5 & 1) * auVar25[0x3d];
        auVar26[0x3e] = (bVar8 >> 6 & 1) * auVar25[0x3e];
        auVar26[0x3f] = -((char)bVar8 >> 7) * auVar25[0x3f];
        vpcmpeqb_avx512bw(auVar26,auVar22);
        auVar25 = vmovdqu8_avx512bw(auVar23);
        *(undefined1 (*) [64])(local_70._M_dataplus._M_p + uVar10) = auVar25;
        uVar10 = uVar10 + 0x40;
      } while ((local_70._M_string_length + 0x3f & 0xffffffffffffffc0) != uVar10);
      if (local_70._M_string_length != 0) {
        auVar22 = vpbroadcastb_avx512bw(ZEXT116(0x3e));
        auVar23 = vpbroadcastb_avx512bw(ZEXT116(0x5d));
        auVar24 = vpbroadcastq_avx512f();
        uVar10 = 0;
        do {
          auVar25 = vpbroadcastq_avx512f();
          auVar26 = vporq_avx512f(auVar25,auVar14);
          auVar27 = vporq_avx512f(auVar25,auVar18);
          auVar28 = vporq_avx512f(auVar25,auVar20);
          auVar29 = vporq_avx512f(auVar25,auVar15);
          auVar30 = vporq_avx512f(auVar25,auVar16);
          auVar31 = vporq_avx512f(auVar25,auVar17);
          auVar32 = vporq_avx512f(auVar25,auVar19);
          auVar25 = vporq_avx512f(auVar25,auVar21);
          uVar1 = vpcmpuq_avx512f(auVar25,auVar24,2);
          uVar2 = vpcmpuq_avx512f(auVar28,auVar24,2);
          uVar3 = vpcmpuq_avx512f(auVar27,auVar24,2);
          uVar4 = vpcmpuq_avx512f(auVar26,auVar24,2);
          bVar8 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar32,auVar24,2);
          uVar5 = vpcmpuq_avx512f(auVar30,auVar24,2);
          uVar6 = vpcmpuq_avx512f(auVar31,auVar24,2);
          uVar7 = vpcmpuq_avx512f(auVar29,auVar24,2);
          uVar13 = CONCAT11(bVar8,(byte)uVar7);
          uVar11 = CONCAT22(uVar13,CONCAT11((byte)uVar5,(byte)uVar6));
          uVar12 = CONCAT44(uVar11,CONCAT22(CONCAT11((byte)uVar3,(byte)uVar4),
                                            CONCAT11((byte)uVar2,(byte)uVar1)));
          auVar25 = vmovdqu8_avx512bw(*(undefined1 (*) [64])(local_70._M_dataplus._M_p + uVar10));
          auVar27[1] = ((byte)(uVar12 >> 1) & 1) * auVar25[1];
          auVar27[0] = ((byte)uVar1 & 1) * auVar25[0];
          auVar27[2] = ((byte)(uVar12 >> 2) & 1) * auVar25[2];
          auVar27[3] = ((byte)(uVar12 >> 3) & 1) * auVar25[3];
          auVar27[4] = ((byte)(uVar12 >> 4) & 1) * auVar25[4];
          auVar27[5] = ((byte)(uVar12 >> 5) & 1) * auVar25[5];
          auVar27[6] = ((byte)(uVar12 >> 6) & 1) * auVar25[6];
          auVar27[7] = ((byte)(uVar12 >> 7) & 1) * auVar25[7];
          auVar27[8] = ((byte)uVar2 & 1) * auVar25[8];
          auVar27[9] = ((byte)(uVar12 >> 9) & 1) * auVar25[9];
          auVar27[10] = ((byte)(uVar12 >> 10) & 1) * auVar25[10];
          auVar27[0xb] = ((byte)(uVar12 >> 0xb) & 1) * auVar25[0xb];
          auVar27[0xc] = ((byte)(uVar12 >> 0xc) & 1) * auVar25[0xc];
          auVar27[0xd] = ((byte)(uVar12 >> 0xd) & 1) * auVar25[0xd];
          auVar27[0xe] = ((byte)(uVar12 >> 0xe) & 1) * auVar25[0xe];
          auVar27[0xf] = ((byte)(uVar12 >> 0xf) & 1) * auVar25[0xf];
          auVar27[0x10] = ((byte)uVar4 & 1) * auVar25[0x10];
          auVar27[0x11] = ((byte)(uVar12 >> 0x11) & 1) * auVar25[0x11];
          auVar27[0x12] = ((byte)(uVar12 >> 0x12) & 1) * auVar25[0x12];
          auVar27[0x13] = ((byte)(uVar12 >> 0x13) & 1) * auVar25[0x13];
          auVar27[0x14] = ((byte)(uVar12 >> 0x14) & 1) * auVar25[0x14];
          auVar27[0x15] = ((byte)(uVar12 >> 0x15) & 1) * auVar25[0x15];
          auVar27[0x16] = ((byte)(uVar12 >> 0x16) & 1) * auVar25[0x16];
          auVar27[0x17] = ((byte)(uVar12 >> 0x17) & 1) * auVar25[0x17];
          auVar27[0x18] = ((byte)uVar3 & 1) * auVar25[0x18];
          auVar27[0x19] = ((byte)(uVar12 >> 0x19) & 1) * auVar25[0x19];
          auVar27[0x1a] = ((byte)(uVar12 >> 0x1a) & 1) * auVar25[0x1a];
          auVar27[0x1b] = ((byte)(uVar12 >> 0x1b) & 1) * auVar25[0x1b];
          auVar27[0x1c] = ((byte)(uVar12 >> 0x1c) & 1) * auVar25[0x1c];
          auVar27[0x1d] = ((byte)(uVar12 >> 0x1d) & 1) * auVar25[0x1d];
          auVar27[0x1e] = ((byte)(uVar12 >> 0x1e) & 1) * auVar25[0x1e];
          auVar27[0x1f] = ((byte)(uVar12 >> 0x1f) & 1) * auVar25[0x1f];
          auVar27[0x20] = ((byte)uVar6 & 1) * auVar25[0x20];
          auVar27[0x21] = ((byte)(uVar11 >> 1) & 1) * auVar25[0x21];
          auVar27[0x22] = ((byte)(uVar11 >> 2) & 1) * auVar25[0x22];
          auVar27[0x23] = ((byte)(uVar11 >> 3) & 1) * auVar25[0x23];
          auVar27[0x24] = ((byte)(uVar11 >> 4) & 1) * auVar25[0x24];
          auVar27[0x25] = ((byte)(uVar11 >> 5) & 1) * auVar25[0x25];
          auVar27[0x26] = ((byte)(uVar11 >> 6) & 1) * auVar25[0x26];
          auVar27[0x27] = ((byte)(uVar11 >> 7) & 1) * auVar25[0x27];
          auVar27[0x28] = ((byte)uVar5 & 1) * auVar25[0x28];
          auVar27[0x29] = ((byte)(uVar11 >> 9) & 1) * auVar25[0x29];
          auVar27[0x2a] = ((byte)(uVar11 >> 10) & 1) * auVar25[0x2a];
          auVar27[0x2b] = ((byte)(uVar11 >> 0xb) & 1) * auVar25[0x2b];
          auVar27[0x2c] = ((byte)(uVar11 >> 0xc) & 1) * auVar25[0x2c];
          auVar27[0x2d] = ((byte)(uVar11 >> 0xd) & 1) * auVar25[0x2d];
          auVar27[0x2e] = ((byte)(uVar11 >> 0xe) & 1) * auVar25[0x2e];
          auVar27[0x2f] = ((byte)(uVar11 >> 0xf) & 1) * auVar25[0x2f];
          auVar27[0x30] = ((byte)uVar7 & 1) * auVar25[0x30];
          auVar27[0x31] = ((byte)(uVar13 >> 1) & 1) * auVar25[0x31];
          auVar27[0x32] = ((byte)(uVar13 >> 2) & 1) * auVar25[0x32];
          auVar27[0x33] = ((byte)(uVar13 >> 3) & 1) * auVar25[0x33];
          auVar27[0x34] = ((byte)(uVar13 >> 4) & 1) * auVar25[0x34];
          auVar27[0x35] = ((byte)(uVar13 >> 5) & 1) * auVar25[0x35];
          auVar27[0x36] = ((byte)(uVar13 >> 6) & 1) * auVar25[0x36];
          auVar27[0x37] = ((byte)(uVar13 >> 7) & 1) * auVar25[0x37];
          auVar27[0x38] = (bVar8 & 1) * auVar25[0x38];
          auVar27[0x39] = (bVar8 >> 1 & 1) * auVar25[0x39];
          auVar27[0x3a] = (bVar8 >> 2 & 1) * auVar25[0x3a];
          auVar27[0x3b] = (bVar8 >> 3 & 1) * auVar25[0x3b];
          auVar27[0x3c] = (bVar8 >> 4 & 1) * auVar25[0x3c];
          auVar27[0x3d] = (bVar8 >> 5 & 1) * auVar25[0x3d];
          auVar27[0x3e] = (bVar8 >> 6 & 1) * auVar25[0x3e];
          auVar27[0x3f] = -((char)bVar8 >> 7) * auVar25[0x3f];
          vpcmpeqb_avx512bw(auVar27,auVar22);
          auVar25 = vmovdqu8_avx512bw(auVar23);
          *(undefined1 (*) [64])(local_70._M_dataplus._M_p + uVar10) = auVar25;
          uVar10 = uVar10 + 0x40;
        } while ((local_70._M_string_length + 0x3f & 0xffffffffffffffc0) != uVar10);
        if (local_70._M_string_length != 0) {
          auVar22 = vpbroadcastb_avx512bw(ZEXT116(0x20));
          auVar23 = vpbroadcastb_avx512bw(ZEXT116(0x5f));
          auVar24 = vpbroadcastq_avx512f();
          uVar10 = 0;
          do {
            auVar25 = vpbroadcastq_avx512f();
            auVar26 = vporq_avx512f(auVar25,auVar14);
            auVar27 = vporq_avx512f(auVar25,auVar18);
            auVar28 = vporq_avx512f(auVar25,auVar20);
            auVar29 = vporq_avx512f(auVar25,auVar15);
            auVar30 = vporq_avx512f(auVar25,auVar16);
            auVar31 = vporq_avx512f(auVar25,auVar17);
            auVar32 = vporq_avx512f(auVar25,auVar19);
            auVar25 = vporq_avx512f(auVar25,auVar21);
            uVar1 = vpcmpuq_avx512f(auVar25,auVar24,2);
            uVar2 = vpcmpuq_avx512f(auVar28,auVar24,2);
            uVar3 = vpcmpuq_avx512f(auVar27,auVar24,2);
            uVar4 = vpcmpuq_avx512f(auVar26,auVar24,2);
            bVar8 = (byte)uVar4;
            uVar4 = vpcmpuq_avx512f(auVar32,auVar24,2);
            uVar5 = vpcmpuq_avx512f(auVar30,auVar24,2);
            uVar6 = vpcmpuq_avx512f(auVar31,auVar24,2);
            uVar7 = vpcmpuq_avx512f(auVar29,auVar24,2);
            uVar13 = CONCAT11(bVar8,(byte)uVar7);
            uVar11 = CONCAT22(uVar13,CONCAT11((byte)uVar5,(byte)uVar6));
            uVar12 = CONCAT44(uVar11,CONCAT22(CONCAT11((byte)uVar3,(byte)uVar4),
                                              CONCAT11((byte)uVar2,(byte)uVar1)));
            auVar25 = vmovdqu8_avx512bw(*(undefined1 (*) [64])(local_70._M_dataplus._M_p + uVar10));
            auVar28[1] = ((byte)(uVar12 >> 1) & 1) * auVar25[1];
            auVar28[0] = ((byte)uVar1 & 1) * auVar25[0];
            auVar28[2] = ((byte)(uVar12 >> 2) & 1) * auVar25[2];
            auVar28[3] = ((byte)(uVar12 >> 3) & 1) * auVar25[3];
            auVar28[4] = ((byte)(uVar12 >> 4) & 1) * auVar25[4];
            auVar28[5] = ((byte)(uVar12 >> 5) & 1) * auVar25[5];
            auVar28[6] = ((byte)(uVar12 >> 6) & 1) * auVar25[6];
            auVar28[7] = ((byte)(uVar12 >> 7) & 1) * auVar25[7];
            auVar28[8] = ((byte)uVar2 & 1) * auVar25[8];
            auVar28[9] = ((byte)(uVar12 >> 9) & 1) * auVar25[9];
            auVar28[10] = ((byte)(uVar12 >> 10) & 1) * auVar25[10];
            auVar28[0xb] = ((byte)(uVar12 >> 0xb) & 1) * auVar25[0xb];
            auVar28[0xc] = ((byte)(uVar12 >> 0xc) & 1) * auVar25[0xc];
            auVar28[0xd] = ((byte)(uVar12 >> 0xd) & 1) * auVar25[0xd];
            auVar28[0xe] = ((byte)(uVar12 >> 0xe) & 1) * auVar25[0xe];
            auVar28[0xf] = ((byte)(uVar12 >> 0xf) & 1) * auVar25[0xf];
            auVar28[0x10] = ((byte)uVar4 & 1) * auVar25[0x10];
            auVar28[0x11] = ((byte)(uVar12 >> 0x11) & 1) * auVar25[0x11];
            auVar28[0x12] = ((byte)(uVar12 >> 0x12) & 1) * auVar25[0x12];
            auVar28[0x13] = ((byte)(uVar12 >> 0x13) & 1) * auVar25[0x13];
            auVar28[0x14] = ((byte)(uVar12 >> 0x14) & 1) * auVar25[0x14];
            auVar28[0x15] = ((byte)(uVar12 >> 0x15) & 1) * auVar25[0x15];
            auVar28[0x16] = ((byte)(uVar12 >> 0x16) & 1) * auVar25[0x16];
            auVar28[0x17] = ((byte)(uVar12 >> 0x17) & 1) * auVar25[0x17];
            auVar28[0x18] = ((byte)uVar3 & 1) * auVar25[0x18];
            auVar28[0x19] = ((byte)(uVar12 >> 0x19) & 1) * auVar25[0x19];
            auVar28[0x1a] = ((byte)(uVar12 >> 0x1a) & 1) * auVar25[0x1a];
            auVar28[0x1b] = ((byte)(uVar12 >> 0x1b) & 1) * auVar25[0x1b];
            auVar28[0x1c] = ((byte)(uVar12 >> 0x1c) & 1) * auVar25[0x1c];
            auVar28[0x1d] = ((byte)(uVar12 >> 0x1d) & 1) * auVar25[0x1d];
            auVar28[0x1e] = ((byte)(uVar12 >> 0x1e) & 1) * auVar25[0x1e];
            auVar28[0x1f] = ((byte)(uVar12 >> 0x1f) & 1) * auVar25[0x1f];
            auVar28[0x20] = ((byte)uVar6 & 1) * auVar25[0x20];
            auVar28[0x21] = ((byte)(uVar11 >> 1) & 1) * auVar25[0x21];
            auVar28[0x22] = ((byte)(uVar11 >> 2) & 1) * auVar25[0x22];
            auVar28[0x23] = ((byte)(uVar11 >> 3) & 1) * auVar25[0x23];
            auVar28[0x24] = ((byte)(uVar11 >> 4) & 1) * auVar25[0x24];
            auVar28[0x25] = ((byte)(uVar11 >> 5) & 1) * auVar25[0x25];
            auVar28[0x26] = ((byte)(uVar11 >> 6) & 1) * auVar25[0x26];
            auVar28[0x27] = ((byte)(uVar11 >> 7) & 1) * auVar25[0x27];
            auVar28[0x28] = ((byte)uVar5 & 1) * auVar25[0x28];
            auVar28[0x29] = ((byte)(uVar11 >> 9) & 1) * auVar25[0x29];
            auVar28[0x2a] = ((byte)(uVar11 >> 10) & 1) * auVar25[0x2a];
            auVar28[0x2b] = ((byte)(uVar11 >> 0xb) & 1) * auVar25[0x2b];
            auVar28[0x2c] = ((byte)(uVar11 >> 0xc) & 1) * auVar25[0x2c];
            auVar28[0x2d] = ((byte)(uVar11 >> 0xd) & 1) * auVar25[0x2d];
            auVar28[0x2e] = ((byte)(uVar11 >> 0xe) & 1) * auVar25[0x2e];
            auVar28[0x2f] = ((byte)(uVar11 >> 0xf) & 1) * auVar25[0x2f];
            auVar28[0x30] = ((byte)uVar7 & 1) * auVar25[0x30];
            auVar28[0x31] = ((byte)(uVar13 >> 1) & 1) * auVar25[0x31];
            auVar28[0x32] = ((byte)(uVar13 >> 2) & 1) * auVar25[0x32];
            auVar28[0x33] = ((byte)(uVar13 >> 3) & 1) * auVar25[0x33];
            auVar28[0x34] = ((byte)(uVar13 >> 4) & 1) * auVar25[0x34];
            auVar28[0x35] = ((byte)(uVar13 >> 5) & 1) * auVar25[0x35];
            auVar28[0x36] = ((byte)(uVar13 >> 6) & 1) * auVar25[0x36];
            auVar28[0x37] = ((byte)(uVar13 >> 7) & 1) * auVar25[0x37];
            auVar28[0x38] = (bVar8 & 1) * auVar25[0x38];
            auVar28[0x39] = (bVar8 >> 1 & 1) * auVar25[0x39];
            auVar28[0x3a] = (bVar8 >> 2 & 1) * auVar25[0x3a];
            auVar28[0x3b] = (bVar8 >> 3 & 1) * auVar25[0x3b];
            auVar28[0x3c] = (bVar8 >> 4 & 1) * auVar25[0x3c];
            auVar28[0x3d] = (bVar8 >> 5 & 1) * auVar25[0x3d];
            auVar28[0x3e] = (bVar8 >> 6 & 1) * auVar25[0x3e];
            auVar28[0x3f] = -((char)bVar8 >> 7) * auVar25[0x3f];
            vpcmpeqb_avx512bw(auVar28,auVar22);
            auVar25 = vmovdqu8_avx512bw(auVar23);
            *(undefined1 (*) [64])(local_70._M_dataplus._M_p + uVar10) = auVar25;
            uVar10 = uVar10 + 0x40;
          } while ((local_70._M_string_length + 0x3f & 0xffffffffffffffc0) != uVar10);
        }
      }
    }
    std::operator+(&local_50,"_version_",&local_70);
    local_28 = &local_74;
    local_30 = local_50._M_dataplus._M_p;
    local_20 = 0;
    (*(this->super_ChArchive)._vptr_ChArchive[3])(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

virtual void out_version(int mver, const std::type_info& mtype) {
          if (use_versions) {
              const char* class_name = "";
                  try {
                      class_name = ChClassFactory::GetClassTagName(mtype).c_str(); // registered
                  } catch(const ChException &) {   
                      class_name = mtype.name();
                  }
				  std::string class_name_polished = class_name;
				  // to avoid troubles in xml archives
				  std::replace(class_name_polished.begin(), class_name_polished.end(), '<', '[');
				  std::replace(class_name_polished.begin(), class_name_polished.end(), '>', ']');
				  std::replace(class_name_polished.begin(), class_name_polished.end(), ' ', '_');
              this->out(ChNameValue<int>(("_version_" + class_name_polished).c_str(), mver));
          }
      }